

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionExpr.cpp
# Opt level: O3

AssertionExpr *
slang::ast::FirstMatchAssertionExpr::fromSyntax
          (FirstMatchSequenceExprSyntax *syntax,ASTContext *context)

{
  Scope *pSVar1;
  SequenceExprSyntax *pSVar2;
  Compilation *this;
  int iVar3;
  undefined4 extraout_var;
  FirstMatchAssertionExpr *pFVar4;
  char *func;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> local_38;
  AssertionExpr *this_00;
  
  pSVar1 = (context->scope).ptr;
  if (pSVar1 == (Scope *)0x0) {
    func = 
    "T slang::not_null<const slang::ast::Scope *>::get() const [T = const slang::ast::Scope *]";
  }
  else {
    pSVar2 = (syntax->expr).ptr;
    if (pSVar2 != (SequenceExprSyntax *)0x0) {
      this = pSVar1->compilation;
      iVar3 = AssertionExpr::bind((int)pSVar2,(sockaddr *)context,0);
      this_00 = (AssertionExpr *)CONCAT44(extraout_var,iVar3);
      AssertionExpr::requireSequence(this_00,context,(DiagCode)0x300008);
      local_38 = (span<const_slang::ast::Expression_*const,_18446744073709551615UL>)ZEXT816(0);
      if (syntax->matchList != (SequenceMatchListSyntax *)0x0) {
        local_38 = bindMatchItems(syntax->matchList,context,this_00);
      }
      pFVar4 = BumpAllocator::
               emplace<slang::ast::FirstMatchAssertionExpr,slang::ast::AssertionExpr_const&,nonstd::span_lite::span<slang::ast::Expression_const*const,18446744073709551615ul>&>
                         (&this->super_BumpAllocator,this_00,&local_38);
      return &pFVar4->super_AssertionExpr;
    }
    func = 
    "T slang::not_null<slang::syntax::SequenceExprSyntax *>::get() const [T = slang::syntax::SequenceExprSyntax *]"
    ;
  }
  assert::assertFailed
            ("ptr",
             "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
             ,0x26,func);
}

Assistant:

bool visitInvalid(const AssertionExpr&) { return false; }